

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCodeAndObjectIDTypeList * __thiscall
PDFDocumentHandler::CreateFormXObjectsFromPDF
          (EStatusCodeAndObjectIDTypeList *__return_storage_ptr__,PDFDocumentHandler *this,
          IByteReaderWithPosition *inPDFStream,PDFParsingOptions *inParsingOptions,
          PDFPageRange *inPageRange,IPageEmbedInFormCommand *inPageEmbedCommand,
          double *inTransformationMatrix,ObjectIDTypeList *inCopyAdditionalObjects,
          ObjectIDTypeList *inPredefinedFormIDs)

{
  EStatusCode EVar1;
  list<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  EStatusCode local_3c;
  IPageEmbedInFormCommand *local_38;
  IPageEmbedInFormCommand *inPageEmbedCommand_local;
  PDFPageRange *inPageRange_local;
  PDFParsingOptions *inParsingOptions_local;
  IByteReaderWithPosition *inPDFStream_local;
  PDFDocumentHandler *this_local;
  
  local_38 = inPageEmbedCommand;
  inPageEmbedCommand_local = (IPageEmbedInFormCommand *)inPageRange;
  inPageRange_local = (PDFPageRange *)inParsingOptions;
  inParsingOptions_local = (PDFParsingOptions *)inPDFStream;
  inPDFStream_local = (IByteReaderWithPosition *)this;
  this_local = (PDFDocumentHandler *)__return_storage_ptr__;
  EVar1 = StartStreamCopyingContext(this,inPDFStream,inParsingOptions);
  if (EVar1 == eSuccess) {
    CreateFormXObjectsFromPDFInContext
              (__return_storage_ptr__,this,(PDFPageRange *)inPageEmbedCommand_local,local_38,
               inTransformationMatrix,inCopyAdditionalObjects,inPredefinedFormIDs);
  }
  else {
    local_3c = eFailure;
    local_58.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
    local_58.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_58.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size
         = 0;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(&local_58);
    std::
    pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::
    pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_true>
              (__return_storage_ptr__,&local_3c,&local_58);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

EStatusCodeAndObjectIDTypeList PDFDocumentHandler::CreateFormXObjectsFromPDF(	IByteReaderWithPosition* inPDFStream,
																				const PDFParsingOptions& inParsingOptions,
																					const PDFPageRange& inPageRange,
																				IPageEmbedInFormCommand* inPageEmbedCommand,
																				const double* inTransformationMatrix,
																				const ObjectIDTypeList& inCopyAdditionalObjects,
																				const ObjectIDTypeList& inPredefinedFormIDs)
{
	if(StartStreamCopyingContext(inPDFStream, inParsingOptions) != PDFHummus::eSuccess)
		return EStatusCodeAndObjectIDTypeList(PDFHummus::eFailure,ObjectIDTypeList());

	return CreateFormXObjectsFromPDFInContext(inPageRange,inPageEmbedCommand,inTransformationMatrix,inCopyAdditionalObjects, inPredefinedFormIDs);
}